

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O1

int Sbd_ManImplement(Sbd_Man_t *p,int Pivot,word Truth)

{
  undefined1 *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Gia_Man_t *p_00;
  int *piVar5;
  Gia_Obj_t *pGVar6;
  ulong uVar7;
  uint uVar8;
  Vec_Int_t *pVVar9;
  int Fill;
  int iVar10;
  int iVar11;
  long lVar12;
  word local_38;
  
  local_38 = Truth;
  if (-1 < Pivot) {
    uVar7 = (ulong)(uint)Pivot;
    if (Pivot < p->vLutLevs->nSize) {
      iVar10 = p->pGia->nObjs;
      iVar2 = p->vLutLevs->pArray[uVar7];
      p->vLits->nSize = 0;
      pVVar9 = p->vDivSet;
      if (0 < pVVar9->nSize) {
        lVar12 = 0;
        do {
          iVar11 = pVVar9->pArray[lVar12];
          if (((long)iVar11 < 0) || (p->vWinObjs->nSize <= iVar11)) goto LAB_00536f80;
          iVar11 = p->vWinObjs->pArray[iVar11];
          if (((long)iVar11 < 0) || (p->vMirrors->nSize <= iVar11)) goto LAB_00536f80;
          iVar3 = p->vMirrors->pArray[iVar11];
          iVar11 = iVar11 * 2;
          if (-1 < iVar3) {
            iVar11 = iVar3;
          }
          Vec_IntPush(p->vLits,iVar11);
          lVar12 = lVar12 + 1;
          pVVar9 = p->vDivSet;
        } while (lVar12 < pVVar9->nSize);
      }
      p_00 = p->pGia;
      if ((p_00->nXors != 0) && (p_00->pMuxes == (uint *)0x0)) {
        p_00->pMuxes = (uint *)p;
      }
      uVar8 = Dsm_ManTruthToGia(p_00,&local_38,p->vLits,p->vCover);
      if ((Sbd_Man_t *)p->pGia->pMuxes == p) {
        p->pGia->pMuxes = (uint *)0x0;
      }
      if (Pivot < p->vMirrors->nSize) {
        piVar5 = p->vMirrors->pArray;
        if (piVar5[uVar7] != -1) {
          __assert_fail("Vec_IntEntry(p->vMirrors, Pivot) == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                        ,0x70e,"int Sbd_ManImplement(Sbd_Man_t *, int, word)");
        }
        piVar5[uVar7] = uVar8;
        if (p->pPars->fVerbose != 0) {
          printf("Replacing node %d by literal %d.\n",uVar7,(ulong)uVar8);
        }
        pVVar9 = p->vLits;
        if (0 < pVVar9->nSize) {
          piVar5 = pVVar9->pArray;
          lVar12 = 0;
          do {
            uVar4 = piVar5[lVar12];
            if ((int)uVar4 < 0) goto LAB_00536fbe;
            piVar5[lVar12] = uVar4 >> 1;
            lVar12 = lVar12 + 1;
          } while (lVar12 < pVVar9->nSize);
        }
        pVVar9 = p->vLits;
        if (0 < pVVar9->nSize) {
          lVar12 = 0;
          do {
            iVar11 = pVVar9->pArray[lVar12];
            if (((long)iVar11 < 0) || (p->pGia->nObjs <= iVar11)) goto LAB_00536f9f;
            pGVar6 = p->pGia->pObjs;
            if (pGVar6 == (Gia_Obj_t *)0x0) break;
            puVar1 = &pGVar6[iVar11].field_0x3;
            *puVar1 = *puVar1 | 0x40;
            lVar12 = lVar12 + 1;
            pVVar9 = p->vLits;
          } while (lVar12 < pVVar9->nSize);
        }
        if (p->vLutLevs->nSize != iVar10) {
          __assert_fail("Vec_IntSize(p->vLutLevs) == iObjLast",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                        ,0x719,"int Sbd_ManImplement(Sbd_Man_t *, int, word)");
        }
        for (; iVar10 < p->pGia->nObjs; iVar10 = iVar10 + 1) {
          Vec_IntPush(p->vLutLevs,0);
          Vec_IntPush(p->vObj2Var,0);
          Vec_IntPush(p->vMirrors,-1);
          Vec_IntFillExtra(p->vLutCuts,p->vLutCuts->nSize + p->pPars->nLutSize + 1,Fill);
          Sbd_ManFindCut(p,iVar10,p->vLits);
          lVar12 = 0;
          do {
            if (0 < p->pPars->nWords) {
              iVar11 = 0;
              do {
                Vec_WrdPush(p->vSims[lVar12],0);
                iVar11 = iVar11 + 1;
              } while (iVar11 < p->pPars->nWords);
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 != 4);
        }
        pVVar9 = p->vLits;
        if (0 < pVVar9->nSize) {
          lVar12 = 0;
          do {
            iVar10 = pVVar9->pArray[lVar12];
            if (((long)iVar10 < 0) || (p->pGia->nObjs <= iVar10)) {
LAB_00536f9f:
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            pGVar6 = p->pGia->pObjs;
            if (pGVar6 == (Gia_Obj_t *)0x0) break;
            puVar1 = &pGVar6[iVar10].field_0x3;
            *puVar1 = *puVar1 & 0xbf;
            lVar12 = lVar12 + 1;
            pVVar9 = p->vLits;
          } while (lVar12 < pVVar9->nSize);
        }
        if ((int)uVar8 < 0) {
LAB_00536fbe:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        iVar10 = p->vLutLevs->nSize;
        if ((int)(uVar8 >> 1) < iVar10) {
          piVar5 = p->vLutLevs->pArray;
          if (iVar2 <= piVar5[uVar8 >> 1]) {
            __assert_fail("iNewLev < iCurLev",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                          ,0x72a,"int Sbd_ManImplement(Sbd_Man_t *, int, word)");
          }
          if (Pivot < iVar10) {
            if (piVar5[uVar7] == iVar2) {
              piVar5[uVar7] = piVar5[uVar8 >> 1];
              return 0;
            }
            __assert_fail("Vec_IntEntry(p->vLutLevs, Pivot) == iCurLev",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                          ,0x72c,"int Sbd_ManImplement(Sbd_Man_t *, int, word)");
          }
        }
      }
    }
  }
LAB_00536f80:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Sbd_ManImplement( Sbd_Man_t * p, int Pivot, word Truth )
{
    Gia_Obj_t * pObj;
    int i, k, w, iLit, Entry, Node;
    int iObjLast = Gia_ManObjNum(p->pGia);
    int iCurLev = Vec_IntEntry(p->vLutLevs, Pivot);
    int iNewLev;
    // collect leaf literals
    Vec_IntClear( p->vLits );
    Vec_IntForEachEntry( p->vDivSet, Node, i )
    {
        Node = Vec_IntEntry( p->vWinObjs, Node );
        if ( Vec_IntEntry(p->vMirrors, Node) >= 0 )
            Vec_IntPush( p->vLits, Vec_IntEntry(p->vMirrors, Node) );
        else
            Vec_IntPush( p->vLits, Abc_Var2Lit(Node, 0) );
    }
    // pretend to have MUXes
//    assert( p->pGia->pMuxes == NULL );
    if ( p->pGia->nXors && p->pGia->pMuxes == NULL )
        p->pGia->pMuxes = (unsigned *)p;
    // derive new function of the node
    iLit = Dsm_ManTruthToGia( p->pGia, &Truth, p->vLits, p->vCover );
    if ( p->pGia->pMuxes == (unsigned *)p )
        p->pGia->pMuxes = NULL;
    // remember this function
    assert( Vec_IntEntry(p->vMirrors, Pivot) == -1 );
    Vec_IntWriteEntry( p->vMirrors, Pivot, iLit );
    if ( p->pPars->fVerbose )
        printf( "Replacing node %d by literal %d.\n", Pivot, iLit );
    // translate literals into variables
    Vec_IntForEachEntry( p->vLits, Entry, i )
        Vec_IntWriteEntry( p->vLits, i, Abc_Lit2Var(Entry) );
    // label inputs
    Gia_ManForEachObjVec( p->vLits, p->pGia, pObj, i )
        pObj->fMark0 = 1;
    // extend data-structure to accommodate new nodes
    assert( Vec_IntSize(p->vLutLevs) == iObjLast );
    for ( i = iObjLast; i < Gia_ManObjNum(p->pGia); i++ )
    {
        Vec_IntPush( p->vLutLevs, 0 );
        Vec_IntPush( p->vObj2Var, 0 );
        Vec_IntPush( p->vMirrors, -1 );
        Vec_IntFillExtra( p->vLutCuts, Vec_IntSize(p->vLutCuts) + p->pPars->nLutSize + 1, 0 );
        Sbd_ManFindCut( p, i, p->vLits );
        for ( k = 0; k < 4; k++ )
            for ( w = 0; w < p->pPars->nWords; w++ )
                Vec_WrdPush( p->vSims[k], 0 );
    }
    // unlabel inputs
    Gia_ManForEachObjVec( p->vLits, p->pGia, pObj, i )
        pObj->fMark0 = 0;
    // make sure delay reduction is achieved
    iNewLev = Vec_IntEntry( p->vLutLevs, Abc_Lit2Var(iLit) );
    assert( iNewLev < iCurLev );
    // update delay of the initial node
    assert( Vec_IntEntry(p->vLutLevs, Pivot) == iCurLev );
    Vec_IntWriteEntry( p->vLutLevs, Pivot, iNewLev );
    //Vec_IntWriteEntry( p->vLevs, Pivot, 1+Abc_MaxInt(Vec_IntEntry(p->vLevs, Gia_ObjFaninId0(pObj, Pivot)), Vec_IntEntry(p->vLevs, Gia_ObjFaninId1(pObj, Pivot))) );
    return 0;
}